

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

Abc_Cex_t *
Bmc_CexCareSatBasedMinimize
          (Aig_Man_t *p,int nRealPis,Abc_Cex_t *pCex,int fHighEffort,int fCheck,int fVerbose)

{
  Gia_Man_t *p_00;
  Abc_Cex_t *pCexMin;
  Gia_Man_t *pGia;
  int fVerbose_local;
  int fCheck_local;
  int fHighEffort_local;
  Abc_Cex_t *pCex_local;
  int nRealPis_local;
  Aig_Man_t *p_local;
  
  p_00 = Gia_ManFromAigSimple(p);
  p_local = (Aig_Man_t *)Bmc_CexCareSatBasedMinimizeAig(p_00,pCex,fHighEffort,fVerbose);
  if (p_local == (Aig_Man_t *)0x0) {
    Gia_ManStop(p_00);
    p_local = (Aig_Man_t *)0x0;
  }
  else {
    Gia_ManStop(p_00);
  }
  return (Abc_Cex_t *)p_local;
}

Assistant:

Abc_Cex_t * Bmc_CexCareSatBasedMinimize( Aig_Man_t * p, int nRealPis, Abc_Cex_t * pCex, int fHighEffort, int fCheck, int fVerbose )
{
    Gia_Man_t * pGia = Gia_ManFromAigSimple( p );
    Abc_Cex_t * pCexMin = Bmc_CexCareSatBasedMinimizeAig( pGia, pCex, fHighEffort, fVerbose );
    if ( pCexMin == NULL )
    {
        Gia_ManStop( pGia );
        return NULL;
    }
    // unfortunately, cannot verify - ternary simulation does not work
    Gia_ManStop( pGia );
    return pCexMin;
}